

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

shared_ptr<ear::PointSourcePanner> __thiscall
ear::configureAllocentricPanner(ear *this,Layout *layout)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ear::PointSourcePanner> sVar1;
  shared_ptr<ear::AllocentricPanner> local_28;
  Layout *local_18;
  Layout *layout_local;
  
  local_18 = layout;
  layout_local = (Layout *)this;
  checkScreenSpeakers(layout);
  std::make_shared<ear::AllocentricPanner>();
  std::shared_ptr<ear::PointSourcePanner>::shared_ptr<ear::AllocentricPanner,void>
            ((shared_ptr<ear::PointSourcePanner> *)this,&local_28);
  std::shared_ptr<ear::AllocentricPanner>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ear::PointSourcePanner>)
         sVar1.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PointSourcePanner> configureAllocentricPanner(
      const Layout& layout) {
    checkScreenSpeakers(layout);
    return std::make_shared<AllocentricPanner>();
  }